

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void add_global_code(Grammar *g,char *start,char *end,int line)

{
  uint uVar1;
  Code *pCVar2;
  char *pcVar3;
  
  if (g->code == (Code *)0x0) {
    pCVar2 = (Code *)malloc(0x40);
  }
  else {
    if ((g->ncode + 1 & 4) != 0) goto LAB_0013b08a;
    pCVar2 = (Code *)realloc(g->code,(ulong)(g->ncode + 4) << 4);
  }
  g->code = pCVar2;
LAB_0013b08a:
  pcVar3 = dup_str(start,end);
  pCVar2 = g->code;
  uVar1 = g->ncode;
  pCVar2[uVar1].code = pcVar3;
  pCVar2[uVar1].line = line;
  g->ncode = uVar1 + 1;
  return;
}

Assistant:

void add_global_code(Grammar *g, char *start, char *end, int line) {
  if (!g->code)
    g->code = MALLOC(sizeof(Code) * 4);
  else if (!((g->ncode + 1) & 4))
    g->code = REALLOC(g->code, sizeof(Code) * (g->ncode + 4));
  g->code[g->ncode].code = dup_str(start, end);
  g->code[g->ncode].line = line;
  g->ncode++;
}